

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::ReadAllBoardsBroadcast(BasePort *this)

{
  double *pdVar1;
  double dVar2;
  uchar *puVar3;
  long lVar4;
  BoardIO *pBVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ostream *poVar12;
  bool bVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  char *pcVar17;
  uint *__s;
  ulong uVar18;
  bool *pbVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar20;
  double dVar21;
  uint local_88;
  long *local_50 [2];
  long local_40 [2];
  
  iVar7 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar7 == '\0') {
    poVar12 = this->outStr;
    pcVar17 = "BasePort::ReadAllBoardsBroadcast: port not initialized";
    lVar11 = 0x36;
LAB_00112ffb:
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,lVar11);
LAB_00113003:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  else {
    if (((this->IsAllBoardsRev4_6_ == false) && (this->IsAllBoardsRev7_ == false)) &&
       (this->IsAllBoardsRev8_9_ == false)) {
      poVar12 = this->outStr;
      pcVar17 = "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware";
      lVar11 = 0x39;
      goto LAB_00112ffb;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ReadAllBoardsBroadcast","");
    iVar7 = (*this->_vptr_BasePort[0x1b])(this,(string *)local_50,(ulong)this->autoReScan);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((char)iVar7 != '\0') {
      uVar8 = (this->bcReadInfo).readSequence + 1;
      uVar9 = 1;
      if (uVar8 != 0x10000) {
        uVar9 = uVar8;
      }
      (this->bcReadInfo).readSequence = uVar9;
      iVar7 = (*this->_vptr_BasePort[0x29])(this);
      if ((char)iVar7 != '\0') {
        (*this->_vptr_BasePort[0x2a])(this);
        (this->bcReadInfo).updateStartTime = 1.0;
        (this->bcReadInfo).updateFinishTime = 0.0;
        (this->bcReadInfo).updateOverflow = false;
        (this->bcReadInfo).readOverflow = false;
        lVar11 = 0x141;
        do {
          *(undefined1 *)((long)this->BoardList + lVar11 + -0x40) = 0;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0x341);
        puVar3 = this->ReadBufferBroadcast;
        uVar9 = (*this->_vptr_BasePort[0x18])(this);
        uVar8 = (*this->_vptr_BasePort[0x14])(this);
        __s = (uint *)(puVar3 + (ulong)uVar8 + (ulong)uVar9);
        memset(__s,0,(ulong)(this->bcReadInfo).readSizeQuads << 2);
        iVar7 = (*this->_vptr_BasePort[0x2b])
                          (this,__s,(ulong)((this->bcReadInfo).readSizeQuads << 2));
        if ((char)iVar7 != '\0') {
          (*this->_vptr_BasePort[0x20])(this);
          dVar6 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          if (this->NumOfBoards_ != 0) {
            local_88 = 0;
            bVar15 = true;
            bVar16 = true;
            uVar14 = 0;
LAB_00112b81:
            if ((*__s != 0) && (__s[2] != 0)) goto code_r0x00112b99;
            poVar12 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"BasePort::ReadAllBoardsBroadcast: invalid block after reading ",0x3e
                      );
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," boards",7);
            std::endl<char,std::char_traits<char>>(poVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this->outStr,"Failed to read from board(s) ",0x1d);
            pbVar19 = &(this->bcReadInfo).boardInfo[0].updated;
            lVar11 = 0;
            do {
              if ((((BroadcastBoardInfo *)(pbVar19 + -1))->inUse == true) && (*pbVar19 == false)) {
                poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)this->outStr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              }
              lVar11 = lVar11 + 1;
              pbVar19 = pbVar19 + 0x20;
            } while (lVar11 != 0x10);
            std::endl<char,std::char_traits<char>>(this->outStr);
            bVar15 = false;
            goto LAB_0011319c;
          }
          bVar16 = true;
          bVar15 = true;
LAB_0011319c:
          if (bVar15) {
            if ((this->IsAllBoardsRev7_ != false) || (this->IsAllBoardsRev8_9_ == true)) {
              uVar9 = *__s;
              dVar21 = (double)(((uVar9 & 0xff00) << 8 | uVar9 << 0x18) >> 0x10) * dVar6;
              (this->bcReadInfo).readStartTime = dVar21;
              dVar20 = (double)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8) * dVar6;
              (this->bcReadInfo).readFinishTime = dVar20;
              if (uVar9 == 0) {
                (this->bcReadInfo).gapTime = 0.0;
              }
              else {
                dVar2 = (this->bcReadInfo).updateFinishTime;
                if (dVar21 < dVar2) {
                  (this->bcReadInfo).readStartTime =
                       *(double *)
                        (&DAT_0011d570 + (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) *
                       dVar6 + dVar21;
                  (this->bcReadInfo).readOverflow = true;
                }
                dVar21 = (this->bcReadInfo).readStartTime;
                if (dVar20 < dVar21) {
                  (this->bcReadInfo).readFinishTime =
                       dVar6 * *(double *)
                                (&DAT_0011d570 +
                                (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) + dVar20;
                  (this->bcReadInfo).readOverflow = true;
                }
                dVar21 = dVar21 - dVar2;
                (this->bcReadInfo).gapTime = dVar21;
                if (dVar21 < (this->bcReadInfo).gapTimeMin) {
                  (this->bcReadInfo).gapTimeMin = dVar21;
                }
                pdVar1 = &(this->bcReadInfo).gapTimeMax;
                if (*pdVar1 <= dVar21 && dVar21 != *pdVar1) {
                  (this->bcReadInfo).gapTimeMax = dVar21;
                }
              }
            }
          }
          else {
            lVar11 = 0x50;
            do {
              lVar4 = *(long *)((long)this->BoardList + lVar11 + -0x50);
              if (((lVar4 != 0) && (*(char *)((long)this->BoardList + lVar11 * 4 + -0x40) == '\x01')
                  ) && (*(char *)((long)this->BoardList + lVar11 * 4 + -0x3f) == '\0')) {
                *(undefined1 *)(lVar4 + 0x18) = 0;
                *(int *)(lVar4 + 0x1c) = *(int *)(lVar4 + 0x1c) + 1;
              }
              lVar11 = lVar11 + 8;
            } while (lVar11 != 0xd0);
            (this->bcReadInfo).gapTime = 0.0;
            (this->bcReadInfo).readStartTime = 0.0;
            (this->bcReadInfo).readFinishTime = 0.0;
          }
          if (!bVar16) {
            return bVar15;
          }
          goto LAB_0011302c;
        }
        uVar9 = this->max_board;
        if ((ulong)uVar9 != 0) {
          uVar14 = 0;
          do {
            pBVar5 = this->BoardList[uVar14];
            if (pBVar5 != (BoardIO *)0x0) {
              pBVar5->readValid = false;
              pBVar5->numReadErrors = pBVar5->numReadErrors + 1;
            }
            uVar14 = uVar14 + 1;
          } while (uVar9 != uVar14);
        }
        goto LAB_0011302a;
      }
      poVar12 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = ",
                 0x4f);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      goto LAB_00113003;
    }
    uVar9 = this->max_board;
    if ((ulong)uVar9 != 0) {
      uVar14 = 0;
      do {
        pBVar5 = this->BoardList[uVar14];
        if (pBVar5 != (BoardIO *)0x0) {
          pBVar5->readValid = false;
          pBVar5->numReadErrors = pBVar5->numReadErrors + 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar9 != uVar14);
    }
  }
LAB_0011302a:
  bVar15 = false;
LAB_0011302c:
  (*this->_vptr_BasePort[8])(this);
  return bVar15;
code_r0x00112b99:
  uVar9 = __s[2] << 0x18;
  if (((uVar9 & 0xf0000000) == 0x40000000) || (this->IsAllBoardsRev8_9_ != false)) {
    uVar9 = (uVar9 & 0xf000000) >> 0x18;
    iVar7 = (*this->_vptr_BasePort[0x1f])(this);
    uVar18 = (ulong)uVar9;
    if ((char)iVar7 != '\0') {
      uVar18 = uVar14;
    }
    pBVar5 = this->BoardList[uVar18];
    if (((uint)uVar18 == uVar9) || (pBVar5 == (BoardIO *)0x0)) {
      if ((pBVar5 == (BoardIO *)0x0) || ((this->bcReadInfo).boardInfo[uVar18].inUse == false)) {
        if (this->IsAllBoardsRev4_6_ != false) {
          __s = __s + 0x11;
        }
      }
      else {
        (this->bcReadInfo).boardInfo[uVar18].updated = true;
        (this->bcReadInfo).boardInfo[uVar18].blockNum = local_88;
        uVar8 = (*__s & 0xff00) << 8;
        uVar10 = (uVar8 | *__s << 0x18) >> 0x10;
        (this->bcReadInfo).boardInfo[uVar18].sequence = uVar10;
        uVar9 = (this->bcReadInfo).readSequence;
        if (this->IsAllBoardsRev8_9_ == true) {
          uVar9 = uVar9 & 0xff;
          uVar8 = uVar8 >> 0x10;
          (this->bcReadInfo).boardInfo[uVar18].sequence = uVar8;
          bVar13 = (bool)((byte)(*__s >> 0x17) & 1);
          if (uVar8 != uVar9) {
            bVar13 = true;
          }
          (this->bcReadInfo).boardInfo[uVar18].seq_error = bVar13;
          (this->bcReadInfo).boardInfo[uVar18].blockSize = (uint)(byte)*__s;
          uVar8 = (*pBVar5->_vptr_BoardIO[1])();
          if ((this->bcReadInfo).boardInfo[uVar18].blockSize != (uVar8 >> 2) + 1) {
            poVar12 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"BasePort::ReadAllBoardsBroadcast: board ",0x28);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,", blockSize = ",0xe);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,", expected = ",0xd);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::endl<char,std::char_traits<char>>(poVar12);
          }
        }
        else {
          (this->bcReadInfo).boardInfo[uVar18].seq_error = uVar10 != uVar9;
          uVar8 = 0x11;
          if (this->IsAllBoardsRev7_ != false) {
            uVar8 = 0x1d;
          }
          (this->bcReadInfo).boardInfo[uVar18].blockSize = uVar8;
        }
        if ((this->IsAllBoardsRev7_ != false) || (this->IsAllBoardsRev8_9_ == true)) {
          dVar20 = (double)(*__s >> 0x18 | (*__s & 0x7f0000) >> 8) * dVar6;
          (this->bcReadInfo).boardInfo[uVar18].updateTime = dVar20;
          if ((this->bcReadInfo).boardInfo[uVar18].seq_error == false) {
            dVar21 = (this->bcReadInfo).updateFinishTime;
            if (dVar20 < dVar21) {
              (this->bcReadInfo).boardInfo[uVar18].updateTime =
                   *(double *)
                    (&DAT_0011d560 + (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) * dVar6
                   + dVar20;
              (this->bcReadInfo).updateOverflow = true;
            }
            dVar20 = (this->bcReadInfo).boardInfo[uVar18].updateTime;
            if (dVar20 < (this->bcReadInfo).updateStartTime) {
              (this->bcReadInfo).updateStartTime = dVar20;
            }
            if (dVar21 < dVar20) {
              (this->bcReadInfo).updateFinishTime = dVar20;
            }
          }
        }
        if ((this->bcReadInfo).boardInfo[uVar18].seq_error == true) {
          poVar12 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"BasePort::ReadAllBoardsBroadcast: board ",0x28);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,", seq = ",8);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,", expected = ",0xd);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,", diff = ",9);
          poVar12 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar12,
                               uVar9 - (this->bcReadInfo).boardInfo[uVar18].sequence);
          std::endl<char,std::char_traits<char>>(poVar12);
          pBVar5->readValid = false;
          pBVar5->numReadErrors = pBVar5->numReadErrors + 1;
          bVar15 = false;
        }
        else {
          pBVar5->readValid = true;
          (*pBVar5->_vptr_BoardIO[2])(pBVar5,__s + 1);
          bVar16 = false;
        }
        local_88 = local_88 + 1;
        __s = __s + (this->bcReadInfo).boardInfo[uVar18].blockSize;
      }
      bVar13 = true;
    }
    else {
      poVar12 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"BasePort::ReadAllBoardsBroadcast: board mismatch, expecting ",0x3c);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,", found ",8);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      bVar13 = false;
      bVar15 = false;
    }
  }
  else {
    poVar12 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): ",
               0x47);
    *(uint *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x18) =
         *(uint *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    lVar11 = *(long *)poVar12;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar12 + lVar4 + 0x18) = *(uint *)(poVar12 + lVar4 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar11 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    bVar13 = false;
    bVar15 = false;
  }
  if (((!bVar13) || (0xe < (uint)uVar14)) ||
     (uVar14 = (ulong)((uint)uVar14 + 1), this->NumOfBoards_ <= local_88)) goto LAB_0011319c;
  goto LAB_00112b81;
}

Assistant:

bool BasePort::ReadAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!CheckFwBusGeneration("ReadAllBoardsBroadcast", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    //--- send out broadcast read request -----

    bool rtRead = true;
    bcReadInfo.IncrementSequence();

    if (!WriteBroadcastReadRequest(bcReadInfo.readSequence)) {
        outStr << "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = "
               << bcReadInfo.readSequence << std::endl;
        OnNoneRead();
        return false;
    }

    // Wait for broadcast read data
    WaitBroadcastRead();

    bcReadInfo.PrepareForRead();

    quadlet_t *hubReadBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
    memset(hubReadBuffer, 0, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    bool ret = ReceiveBroadcastReadResponse(hubReadBuffer, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    if (!ret) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    double clkPeriod = GetBroadcastReadClockPeriod();
    quadlet_t *curPtr = hubReadBuffer;
    unsigned int bdCnt = 0;   // Number of board processed
    // Loop through all boards, processing the boards in use.
    // Note that prior to Firmware Rev 7, we always read data for all 16 boards.
    // Starting with Firmware Rev 9, the board data will generally not be in sequential order
    // (i.e., isBroadcastReadOrdered will return false) for the Ethernet-only interface.
    for (unsigned int index = 0; (index < BoardIO::MAX_BOARDS) && (bdCnt < NumOfBoards_); index++) {
        if ((curPtr[0] == 0) || (curPtr[2] == 0)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid block after reading "
                   << bdCnt << " boards" << std::endl;
            outStr << "Failed to read from board(s) ";
            for (size_t i = 0; i < BoardIO::MAX_BOARDS; i++) {
                if (bcReadInfo.boardInfo[i].inUse && !bcReadInfo.boardInfo[i].updated)
                    outStr << i << " ";
            }
            outStr << std::endl;
            allOK = false;
            break;
        }
        quadlet_t statusQuad = bswap_32(curPtr[2]);
        unsigned int numAxes = (statusQuad&0xf0000000)>>28;
        if (!IsAllBoardsRev8_9_ && (numAxes != 4)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): " << std::hex << statusQuad
                   << std::dec << std::endl;
            allOK = false;
            break;
        }
        unsigned int thisBoard = (statusQuad&0x0f000000)>>24;
        unsigned int boardNum = isBroadcastReadOrdered() ? index : thisBoard;
        BoardIO *board = BoardList[boardNum];
        if (board && (boardNum != thisBoard)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: board mismatch, expecting "
                   << boardNum << ", found " << thisBoard << std::endl;
            allOK = false;
            break;
        }
        if (bcReadInfo.boardInfo[boardNum].inUse && board) {
            bool thisOK = false;
            bcReadInfo.boardInfo[boardNum].updated = true;
            bcReadInfo.boardInfo[boardNum].blockNum = bdCnt++;
            bcReadInfo.boardInfo[boardNum].sequence = bswap_32(curPtr[0]) >> 16;
            unsigned int seq_expected = bcReadInfo.readSequence;
            if (IsAllBoardsRev8_9_) {
                // For Rev 8+, only the LSB of the sequence is returned, but bit 15 also indicates
                // whether the 16-bit sequence number did not match on the FPGA side.
                seq_expected &= 0x00ff;
                bcReadInfo.boardInfo[boardNum].sequence &= 0x00ff;  // lowest byte only
                bcReadInfo.boardInfo[boardNum].seq_error = bswap_32(curPtr[0]) & 0x00008000;  // bit 15
                if (bcReadInfo.boardInfo[boardNum].sequence != seq_expected)
                    bcReadInfo.boardInfo[boardNum].seq_error = true;
                bcReadInfo.boardInfo[boardNum].blockSize = (bswap_32(curPtr[0]) & 0xff000000) >> 24;
                unsigned int bdReadSize = board->GetReadNumBytes()/sizeof(quadlet_t) + 1;
                if (bcReadInfo.boardInfo[boardNum].blockSize != bdReadSize) {
                    outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                           << ", blockSize = " << bcReadInfo.boardInfo[boardNum].blockSize
                           << ", expected = " << bdReadSize << std::endl;
                }
            }
            else {
                bcReadInfo.boardInfo[boardNum].seq_error = (bcReadInfo.boardInfo[boardNum].sequence != seq_expected);
                // Rev7 block size is 29 (1 + 28), Rev4_6 block size is 17 (should have been 21)
                bcReadInfo.boardInfo[boardNum].blockSize = IsAllBoardsRev7_ ? 29 : 17;
            }
            if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
                unsigned int quad0_lsb = bswap_32(curPtr[0])&0x0000ffff;
                bcReadInfo.boardInfo[boardNum].updateTime = (quad0_lsb&0x7fff)*clkPeriod;
                if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                    // Set the update Start/Finish times based on the minimum and maximum update times
                    // Note that update times should be increasing, so if our current updateTime is
                    // less than the previous max (updateFinishTime), then there must have been overflow
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateFinishTime) {
                        // Firmware Rev 9 uses 15 bits; prior versions use 14 bits
                        uint16_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x4000 : 0x8000;
                        bcReadInfo.boardInfo[boardNum].updateTime += overflow_val*clkPeriod;
                        bcReadInfo.updateOverflow = true;
                    }
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateStartTime)
                        bcReadInfo.updateStartTime = bcReadInfo.boardInfo[boardNum].updateTime;
                    if (bcReadInfo.boardInfo[boardNum].updateTime > bcReadInfo.updateFinishTime)
                        bcReadInfo.updateFinishTime = bcReadInfo.boardInfo[boardNum].updateTime;
                }
            }
            if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                thisOK = true;
            }
            else {
                outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                       << ", seq = " << bcReadInfo.boardInfo[boardNum].sequence
                       << ", expected = " << seq_expected
                       << ", diff = " << static_cast<int>(seq_expected-bcReadInfo.boardInfo[boardNum].sequence)
                       << std::endl;
            }
            board->SetReadValid(thisOK);
            if (thisOK) {
                board->SetReadData(curPtr+1);
                noneRead = false;
            }
            else {
                allOK = false;
            }
            curPtr += bcReadInfo.boardInfo[boardNum].blockSize;
        }
        else if (IsAllBoardsRev4_6_) {
            // Skip unused boards for firmware < 7
            // Rev4_6 block size is 17 (should have been 21)
            curPtr += 17;
        }
    }

    if (!allOK) {
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            BoardIO *board = BoardList[bnum];
            if (board && bcReadInfo.boardInfo[bnum].inUse && !bcReadInfo.boardInfo[bnum].updated) {
               board->SetReadValid(false);
            }
        }
        bcReadInfo.readStartTime = 0.0;
        bcReadInfo.readFinishTime = 0.0;
        bcReadInfo.gapTime = 0.0;
    }
    else if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        quadlet_t timingInfo = bswap_32(curPtr[0]);
        bcReadInfo.readStartTime = ((timingInfo&0xffff0000) >> 16)*clkPeriod;
        bcReadInfo.readFinishTime = (timingInfo&0x0000ffff)*clkPeriod;
        if (timingInfo != 0) {
            // timingInfo == 0 indicates invalid data
            if (bcReadInfo.readStartTime < bcReadInfo.updateFinishTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readStartTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
            if (bcReadInfo.readFinishTime < bcReadInfo.readStartTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readFinishTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
        }
        // Gap between end of update and start of read; this can be tuned to be as
        // close to 0 as possible.
        if (timingInfo == 0) {
            bcReadInfo.gapTime = 0.0;
        }
        else {
            bcReadInfo.gapTime = bcReadInfo.readStartTime - bcReadInfo.updateFinishTime;
            if (bcReadInfo.gapTime < bcReadInfo.gapTimeMin)
                bcReadInfo.gapTimeMin = bcReadInfo.gapTime;
            if (bcReadInfo.gapTime > bcReadInfo.gapTimeMax)
                bcReadInfo.gapTimeMax = bcReadInfo.gapTime;
        }
    }

    if (noneRead) {
        OnNoneRead();
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoardsBroadcast: rtRead is false" << std::endl;

#if 0
    if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        bcReadInfo.PrintTiming(outStr);
    }
#endif

    return allOK;
}